

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomRefCoor(RigidBody *this,Vector3d *coor,Atom *atom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type __n;
  StuntDouble *in_RDX;
  StuntDouble *in_RDI;
  iterator i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  *in_stack_ffffffffffffffa0;
  _Base_ptr *this_00;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  StuntDouble *local_20;
  
  local_20 = in_RDX;
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,OpenMD::Atom*>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(Atom **)in_RDI);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (bVar1) {
    this_00 = &in_RDI[2].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __n = __gnu_cxx::operator-
                    ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)this_00,
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)this_00
               ,__n);
    Vector3<double>::operator=
              ((Vector3<double> *)this_00,
               (Vector3<double> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    uVar2 = StuntDouble::getGlobalIndex(local_20);
    uVar3 = StuntDouble::getGlobalIndex(in_RDI);
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",(ulong)uVar2,
             (ulong)uVar3);
    painCave.isFatal = 0;
    simError();
  }
  return bVar1;
}

Assistant:

bool RigidBody::getAtomRefCoor(Vector3d& coor, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      // RigidBody class makes sure refCoords_ and atoms_ match each other
      coor = refCoords_[i - atoms_.begin()];
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }